

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
djb::matrix::eigenvector
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,matrix *this,
          int iterations)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  vector<double,_std::allocator<double>_> *out;
  double dVar8;
  vector<double,_std::allocator<double>_> vec [2];
  
  vec[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vec[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(vec,(long)this->size);
  std::vector<double,_std::allocator<double>_>::reserve(vec + 1,(long)this->size);
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->size;
  if (this->size < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = 1.0;
  }
  if (iterations < 1) {
    iterations = 0;
  }
  uVar7 = 0;
  for (iVar5 = 0; uVar3 = (ulong)uVar7, iVar5 != iterations; iVar5 = iVar5 + 1) {
    uVar7 = 1 - uVar7;
    out = vec + uVar7;
    transform(this,vec + uVar3,out);
    uVar3 = (ulong)(uint)this->size;
    if (this->size < 1) {
      uVar3 = 0;
    }
    dVar8 = 0.0;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      dVar8 = dVar8 + dVar1 * dVar1;
    }
    if (0.0 < dVar8) {
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      uVar3 = (ulong)(uint)this->size;
      if (this->size < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar2 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[uVar4] = pdVar2[uVar4] * (1.0 / dVar8);
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,vec + uVar3);
  lVar6 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)&vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> matrix::eigenvector(int iterations) const
{
	std::vector<double> vec[2];
	int j = 0;

	vec[0].reserve(size);
	vec[1].reserve(size);

	for (int i = 0; i < size; ++i)
		vec[j][i] = 1.0;
	for (int i = 0; i < iterations; ++i) {
		double nrm = 0;

		transform(vec[j], vec[1-j]);

#if 1
		// normalize the vector
		for (int k = 0; k < size; ++k)
			nrm+= sqr(vec[1-j][k]);
		if (nrm > 0) {
			nrm = inversesqrt(nrm);

			for (int k = 0; k < size; ++k)
				vec[1-j][k]*= nrm;
		}
#endif

		j = 1 - j;
	}

	return vec[j];
}